

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

Bool CheckWrapIndent(TidyDocImpl *doc,uint indent)

{
  Bool extraout_EAX;
  Bool BVar1;
  Bool BVar2;
  
  BVar1 = (doc->pprint).indent[0].spaces;
  BVar2 = no;
  if (0 < (int)BVar1) {
    BVar2 = BVar1;
  }
  if (((doc->config).value[0x5d].v <= (ulong)(BVar2 + (doc->pprint).linelen)) &&
     (WrapLine(doc), BVar1 = extraout_EAX, (doc->pprint).indent[0].spaces < 0)) {
    (doc->pprint).indent[0].spaces = indent;
  }
  return BVar1;
}

Assistant:

static Bool CheckWrapIndent( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;
    if ( GetSpaces(pprint) + pprint->linelen >= cfg(doc, TidyWrapLen) )
    {
        WrapLine( doc );
        if ( pprint->indent[ 0 ].spaces < 0 )
        {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
            SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif
            pprint->indent[ 0 ].spaces = indent;
        }
        return yes;
    }
    return no;
}